

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall wabt::FileStream::FileStream(FileStream *this,FileStream *other)

{
  FileStream *other_local;
  FileStream *this_local;
  
  Stream::Stream(&this->super_Stream,(Stream *)0x0);
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__FileStream_003b70d8;
  operator=(this,other);
  return;
}

Assistant:

FileStream::FileStream(FileStream&& other) {
  *this = std::move(other);
}